

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

Vec_Ptr_t * Bmc_MnaTernary(Gia_Man_t *p,int nFrames,int nFramesAdd,int fVerbose,int *iFirst)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int iVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  long lVar11;
  void *pvVar12;
  char *pcVar13;
  ulong uVar14;
  uint *puVar15;
  long lVar16;
  byte bVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  timespec ts;
  uint local_84;
  timespec local_58;
  ulong local_48;
  ulong uStack_40;
  size_t local_38;
  
  uVar22 = p->vCos->nSize;
  iVar8 = clock_gettime(3,&local_58);
  if (iVar8 < 0) {
    lVar16 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  pGVar5 = p->pObjs;
  pGVar5->Value = 1;
  pVVar6 = p->vCis;
  uVar1 = pVVar6->nSize;
  uVar2 = p->nRegs;
  uVar14 = (ulong)uVar2;
  if (uVar1 - uVar2 != 0 && (int)uVar2 <= (int)uVar1) {
    uVar20 = 0;
    uVar21 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar21 = uVar20;
    }
    do {
      if (uVar21 == uVar20) goto LAB_00569642;
      iVar8 = pVVar6->pArray[uVar20];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00569623;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar5[iVar8].Value = 3;
      uVar20 = uVar20 + 1;
    } while (uVar1 - uVar2 != uVar20);
  }
  if (0 < (int)uVar2) {
    pVVar6 = p->vCos;
    iVar8 = pVVar6->nSize;
    uVar21 = (ulong)(iVar8 - uVar2);
    do {
      if (((int)uVar21 < 0) || (iVar8 <= (int)uVar21)) goto LAB_00569642;
      iVar19 = pVVar6->pArray[uVar21];
      if (((long)iVar19 < 0) || (p->nObjs <= iVar19)) goto LAB_00569623;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar5[iVar19].Value = 1;
      uVar21 = uVar21 + 1;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  *iFirst = -1;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  ppvVar10 = (void **)malloc(800);
  pVVar9->pArray = ppvVar10;
  local_38 = (long)(int)((((int)uVar22 >> 4) + 1) - (uint)((uVar22 & 0xf) == 0)) << 2;
  local_84 = 0;
  do {
    if ((nFrames == 0) && (-1 < *iFirst && local_84 == *iFirst + nFramesAdd)) break;
    iVar8 = p->nRegs;
    lVar11 = (long)iVar8;
    if (0 < lVar11) {
      pVVar6 = p->vCos;
      iVar19 = pVVar6->nSize;
      uVar14 = (ulong)(uint)(iVar19 - iVar8);
      iVar8 = -iVar8;
      do {
        if ((iVar19 + iVar8 < 0) || (iVar19 <= iVar19 + iVar8)) goto LAB_00569642;
        iVar3 = pVVar6->pArray[uVar14];
        if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00569623;
        pGVar5 = p->pObjs;
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        iVar4 = p->vCis->nSize;
        uVar22 = iVar8 + iVar4;
        if (((int)uVar22 < 0) || (iVar4 <= (int)uVar22)) goto LAB_00569642;
        iVar4 = p->vCis->pArray[uVar22];
        if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00569623;
        pGVar5[iVar4].Value = pGVar5[iVar3].Value;
        iVar8 = iVar8 + 1;
        uVar14 = uVar14 + 1;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    uVar14 = (ulong)(uint)p->nObjs;
    if ((0 < p->nObjs) && (p->pObjs != (Gia_Obj_t *)0x0)) {
      puVar15 = &p->pObjs->Value;
      do {
        uVar21 = *(ulong *)(puVar15 + -2);
        if ((uVar21 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar21) {
          iVar8 = *(int *)((long)puVar15 + (ulong)(uint)((int)(uVar21 & 0x1fffffff) << 2) * -3);
          iVar19 = *(int *)((long)puVar15 + (ulong)((uint)(uVar21 >> 0x1e) & 0x7ffffffc) * -3);
          uVar22 = (iVar19 == 3 || iVar8 == 3) | 2;
          if (((uVar21 >> 0x3d & 1) != 0) + 1 == iVar19) {
            uVar22 = 1;
          }
          if ((((uint)uVar21 >> 0x1d & 1) != 0) + 1 == iVar8) {
            uVar22 = 1;
          }
          *puVar15 = uVar22;
        }
        puVar15 = puVar15 + 3;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    pvVar12 = malloc(local_38);
    pVVar6 = p->vCos;
    if (0 < pVVar6->nSize) {
      piVar7 = pVVar6->pArray;
      bVar17 = 0;
      uVar14 = 0;
      do {
        iVar8 = piVar7[uVar14];
        if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00569623;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar5 = p->pObjs + iVar8;
        uVar22 = ((((uint)*(undefined8 *)pGVar5 >> 0x1d & 1) != 0) + 1 !=
                 pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value) + 1;
        if (pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value == 3) {
          uVar22 = 3;
        }
        pGVar5->Value = uVar22;
        uVar21 = uVar14 >> 4 & 0xfffffff;
        uVar1 = *(uint *)((long)pvVar12 + uVar21 * 4);
        *(uint *)((long)pvVar12 + uVar21 * 4) =
             (uVar1 >> (bVar17 & 0x1e) & 3 ^ uVar22) << (bVar17 & 0x1e) ^ uVar1;
        if (((*iFirst == -1) && ((long)uVar14 < (long)pVVar6->nSize - (long)p->nRegs)) &&
           (pGVar5->Value == 3)) {
          *iFirst = local_84;
        }
        uVar14 = uVar14 + 1;
        bVar17 = bVar17 + 2;
      } while ((long)uVar14 < (long)pVVar6->nSize);
    }
    uVar22 = pVVar9->nSize;
    uVar1 = pVVar9->nCap;
    if (uVar22 == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (pVVar9->pArray == (void **)0x0) {
          ppvVar10 = (void **)malloc(0x80);
        }
        else {
          ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
        }
        iVar8 = 0x10;
LAB_0056942c:
        pVVar9->pArray = ppvVar10;
        pVVar9->nCap = iVar8;
      }
      else {
        iVar8 = uVar1 * 2;
        if ((int)uVar1 < iVar8) {
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar9->pArray,(ulong)uVar1 << 4);
          }
          goto LAB_0056942c;
        }
      }
    }
    pVVar9->nSize = uVar22 + 1;
    pVVar9->pArray[(int)uVar22] = pvVar12;
    if (fVerbose != 0) {
      local_48 = 0;
      uStack_40 = 0;
      iVar8 = p->nRegs;
      lVar11 = (long)iVar8;
      if (0 < lVar11) {
        pVVar6 = p->vCos;
        iVar19 = pVVar6->nSize;
        uVar14 = (ulong)(uint)(iVar19 - iVar8);
        lVar18 = lVar11;
        do {
          if (((int)uVar14 < 0) || (iVar19 <= (int)uVar14)) goto LAB_00569642;
          iVar3 = pVVar6->pArray[uVar14];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00569623;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          piVar7 = (int *)((long)&local_48 + (ulong)p->pObjs[iVar3].Value * 4);
          *piVar7 = *piVar7 + 1;
          uVar14 = uVar14 + 1;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      iVar19 = p->vCos->nSize;
      if (iVar19 <= iVar8) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (iVar19 < 1) {
LAB_00569642:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = *p->vCos->pArray;
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_00569623:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pcVar13 = "0";
      if (p->pObjs[iVar8].Value == 3) {
        pcVar13 = "x";
      }
      printf("%5d : 0 =%7d    1 =%7d    x =%7d    all =%7d   out = %s\n",(ulong)local_84,
             local_48 >> 0x20,uStack_40 & 0xffffffff,uStack_40 >> 0x20,lVar11,pcVar13);
    }
    local_84 = local_84 + 1;
  } while (local_84 != nFrames || nFrames == 0);
  if (fVerbose != 0) {
    printf("Finished %d frames. First x-valued PO is in frame %d.  ",(ulong)(uint)nFrames,
           (ulong)(uint)*iFirst);
    iVar19 = 3;
    iVar8 = clock_gettime(3,&local_58);
    if (iVar8 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    Abc_Print(iVar19,"%s =","Time");
    Abc_Print(iVar19,"%9.2f sec\n",SUB84((double)(lVar11 + lVar16) / 1000000.0,0));
  }
  return pVVar9;
}

Assistant:

Vec_Ptr_t * Bmc_MnaTernary( Gia_Man_t * p, int nFrames, int nFramesAdd, int fVerbose, int * iFirst )
{
    Vec_Ptr_t * vStates;
    unsigned * pState;
    int nStateWords = Abc_BitWordNum( 2*Gia_ManCoNum(p) );
    Gia_Obj_t * pObj, * pObjRo;
    int f, i, Count[4];
    abctime clk = Abc_Clock();
    Gia_ManConst0(p)->Value = GIA_ZER;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = GIA_UND;
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = GIA_ZER;
    *iFirst = -1;
    vStates = Vec_PtrAlloc( 100 );
    for ( f = 0; ; f++ )
    {
        // if frames are given, break at frames
        if ( nFrames && f == nFrames )
            break;
        // if frames are not given, break after nFramesAdd from the first x-valued
        if ( !nFrames && *iFirst >= 0 && f == *iFirst + nFramesAdd )
            break;
        // aassign CI values
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->Value = pObj->Value;
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_XsimAndCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj), Gia_ObjFanin1(pObj)->Value, Gia_ObjFaninC1(pObj) );
        // compute and save CO values
        pState = ABC_ALLOC( unsigned, nStateWords );
        Gia_ManForEachCo( p, pObj, i )
        {
            pObj->Value = Gia_XsimNotCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
            Gia_ManTerSimInfoSet( pState, i, pObj->Value );
            if ( *iFirst == -1 && i < Gia_ManPoNum(p) && pObj->Value == GIA_UND )
                *iFirst = f;
        }
        Vec_PtrPush( vStates, pState );
        // print statistics
        if ( !fVerbose )
            continue;
        Count[0] = Count[1] = Count[2] = Count[3] = 0;
        Gia_ManForEachRi( p, pObj, i )
            Count[pObj->Value]++;
        printf( "%5d : 0 =%7d    1 =%7d    x =%7d    all =%7d   out = %s\n", 
            f, Count[GIA_ZER], Count[GIA_ONE], Count[GIA_UND], Gia_ManRegNum(p), 
            Gia_ManPo(p, 0)->Value == GIA_UND ? "x" : "0" );  
    }
//    assert( Vec_PtrSize(vStates) == nFrames );
    if ( fVerbose )
        printf( "Finished %d frames. First x-valued PO is in frame %d.  ", nFrames, *iFirst );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vStates;
}